

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O3

void __thiscall mp::SPAdapter::UpdateConStages(SPAdapter *this,int var_index,int stage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  int iVar7;
  
  piVar4 = (this->problem_->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar4[var_index];
  iVar2 = piVar4[(long)var_index + 1];
  if (iVar2 != iVar1) {
    piVar4 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->problem_->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      iVar3 = piVar5[iVar1 + lVar6];
      iVar7 = piVar4[iVar3];
      if (iVar7 <= stage) {
        iVar7 = stage;
      }
      piVar4[iVar3] = iVar7;
      lVar6 = lVar6 + 1;
    } while (iVar2 - iVar1 != (int)lVar6);
  }
  return;
}

Assistant:

void SPAdapter::UpdateConStages(int var_index, int stage) {
  for (int k = problem_.col_start(var_index),
       end = problem_.col_start(var_index + 1); k != end; ++k) {
    int &con_stage = con_orig2core_[problem_.row_index(k)];
    con_stage = std::max(stage, con_stage);
  }
}